

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O0

Color __thiscall plot::Color::over(Color *this,Color *other)

{
  Color CVar1;
  float local_6c;
  Color local_68;
  Color local_58;
  Color local_48;
  Color local_38;
  Color *local_28;
  Color *other_local;
  Color *this_local;
  
  local_28 = other;
  other_local = this;
  local_48 = premultiplied(this);
  local_68 = premultiplied(local_28);
  local_6c = 1.0 - this->a;
  local_58 = operator*(&local_68,&local_6c);
  local_38 = operator+(&local_48,&local_58);
  CVar1 = unpremultiplied(&local_38);
  return CVar1;
}

Assistant:

constexpr Color over(Color const& other) const {
        return (premultiplied() + other.premultiplied()*(1.0f - a)).unpremultiplied();
    }